

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void jessilib::config::write_object
               (object *in_object,path *in_filename,string *in_format,text_encoding in_encoding)

{
  file_error *this;
  ofstream file;
  string local_248;
  long local_228;
  filebuf local_220 [24];
  byte abStack_208 [216];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,(in_filename->_M_pathname)._M_dataplus._M_p,_S_out|_S_bin);
  if ((abStack_208[*(long *)(local_228 + -0x18)] & 5) == 0) {
    get_format(&local_248,in_filename,in_format);
    serialize_object((ostream *)&local_228,in_object,&local_248,in_encoding);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _c32rtomb;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(local_130);
    return;
  }
  this = (file_error *)__cxa_allocate_exception(0x10);
  file_error::file_error(this,in_filename);
  __cxa_throw(this,&file_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void config::write_object(const object& in_object, const std::filesystem::path& in_filename, const std::string& in_format, text_encoding in_encoding) {
	// Open up file for writing
	std::ofstream file{ in_filename, std::ios::out | std::ios::binary };
	if (!file) {
		// Failed to open the file; throw file_error
		throw file_error( in_filename );
	}

	// Deserialize1
	return serialize_object(file, in_object, get_format(in_filename, in_format), in_encoding);
}